

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O1

void __thiscall
itis::AVLTree<int>::display(AVLTree<int> *this,AVLTreeNode<int> *cur,int depth,int state)

{
  ostream *poVar1;
  char *__format;
  int iVar2;
  
  do {
    if (cur->left != (AVLTreeNode<int> *)0x0) {
      display(this,cur->left,depth + 1,1);
    }
    iVar2 = depth;
    if (0 < depth) {
      do {
        printf("     ");
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    __format = anon_var_dwarf_13e44;
    if (state == 1) {
LAB_001037d8:
      printf(__format);
    }
    else if (state == 2) {
      __format = anon_var_dwarf_13e5a;
      goto LAB_001037d8;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,cur->value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] - (",5);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,cur->count);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,cur->height);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    cur = cur->right;
    if (cur == (AVLTreeNode<int> *)0x0) {
      return;
    }
    depth = depth + 1;
    state = 2;
  } while( true );
}

Assistant:

void AVLTree<T>::display(AVLTreeNode<T> *cur, int depth, int state) {  // state: 1 -> left, 2 -> right , 0 -> root
    if (cur->left) {
      display(cur->left, depth + 1, 1);
    }

    for (int i = 0; i < depth; i++) {
      printf("     ");
    }

    if (state == 1) {  // left
      printf("┌───");
    } else if (state == 2) {  // right
      printf("└───");
    }

    std::cout << "[" << cur->value << "] - (" << cur->count << ", " << cur->height << ")" << std::endl;

    if (cur->right) {
      display(cur->right, depth + 1, 2);
    }
  }